

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

double rcg::getFloat(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,double *vmin,
                    double *vmax,bool exception,bool igncache)

{
  element_type *peVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  invalid_argument *piVar5;
  long *plVar6;
  double dVar7;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  
  if (vmin != (double *)0x0) {
    *vmin = 0.0;
  }
  if (vmax != (double *)0x0) {
    *vmax = 0.0;
  }
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_80,name);
  iVar3 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&local_80);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_80);
  if (plVar4 == (long *)0x0) {
    dVar7 = 0.0;
    if (exception) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Feature not found: ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar4;
      plVar6 = plVar4 + 2;
      if (local_80 == plVar6) {
        local_70 = *plVar6;
        lStack_68 = plVar4[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar6;
      }
      local_78 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar3 = (*(code *)**(undefined8 **)((long)plVar4 + *(long *)(*plVar4 + -0x28)))
                      ((long)plVar4 + *(long *)(*plVar4 + -0x28));
    if (iVar3 - 3U < 2) {
      plVar4 = (long *)__dynamic_cast(plVar4,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
      if (plVar4 == (long *)0x0) {
        dVar7 = 0.0;
        if (exception) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_a0[0] = local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"Feature not float: ","");
          plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
          local_80 = (long *)*plVar4;
          plVar6 = plVar4 + 2;
          if (local_80 == plVar6) {
            local_70 = *plVar6;
            lStack_68 = plVar4[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar6;
          }
          local_78 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        dVar7 = (double)(**(code **)(*plVar4 + 0x48))(plVar4,0,igncache);
        if (vmin != (double *)0x0) {
          dVar2 = (double)(**(code **)(*plVar4 + 0x60))(plVar4);
          *vmin = dVar2;
        }
        if (vmax != (double *)0x0) {
          dVar2 = (double)(**(code **)(*plVar4 + 0x68))(plVar4);
          *vmax = dVar2;
        }
      }
    }
    else {
      dVar7 = 0.0;
      if (exception) {
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"Feature not readable: ","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_a0);
        local_80 = (long *)*plVar4;
        plVar6 = plVar4 + 2;
        if (local_80 == plVar6) {
          local_70 = *plVar6;
          lStack_68 = plVar4[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar6;
        }
        local_78 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar5,(string *)&local_80);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
  }
  return dVar7;
}

Assistant:

double getFloat(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                double *vmin, double *vmax, bool exception, bool igncache)
{
  double ret=0;

  if (vmin != 0) *vmin=0;
  if (vmax != 0) *vmax=0;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        GenApi::IFloat *val=dynamic_cast<GenApi::IFloat *>(node);

        if (val != 0)
        {
          ret=val->GetValue(false, igncache);

          if (vmin != 0) *vmin=val->GetMin();
          if (vmax != 0) *vmax=val->GetMax();
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not float: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}